

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

void rf_update_camera3d(rf_camera3d *camera,rf_camera3d_state *state,
                       rf_input_state_for_update_camera input_state)

{
  rf_vec2 rVar1;
  rf_builtin_camera3d_mode rVar2;
  rf_vec2 rVar3;
  undefined1 auVar4 [16];
  rf_vec2 rVar5;
  rf_camera3d *prVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  bool bVar10;
  uint uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  float fVar21;
  _Bool direction [6];
  char local_5d [5];
  undefined8 local_58;
  float local_50;
  float local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  float local_34;
  
  local_5d[0] = input_state.direction_keys[1];
  local_5d[1] = input_state.direction_keys[2];
  local_5d[2] = input_state.direction_keys[3];
  local_5d[3] = input_state.direction_keys[4];
  local_5d[4] = input_state.direction_keys[5];
  rVar2 = state->camera_mode;
  if (rVar2 == RF_CAMERA_CUSTOM) {
    return;
  }
  rVar1 = state->previous_mouse_position;
  state->previous_mouse_position = input_state.mouse_position;
  if (3 < rVar2 - RF_CAMERA_FREE) {
    return;
  }
  fVar20 = input_state.mouse_position.x - rVar1.x;
  fVar21 = input_state.mouse_position.y - rVar1.y;
  local_58 = camera;
  local_48._0_4_ = fVar20;
  local_48._4_4_ = fVar21;
  switch(rVar2) {
  case RF_CAMERA_FREE:
    fVar13 = state->camera_target_distance;
    if (-1 < input_state.mouse_wheel_move || 120.0 <= fVar13) {
      fVar14 = (camera->position).y;
      fVar12 = (camera->target).y;
      if (fVar14 <= fVar12 || (fVar13 != 120.0 || -1 < input_state.mouse_wheel_move)) {
        if ((fVar14 <= fVar12) || (fVar12 < 0.0)) {
          if ((fVar14 <= fVar12) || (input_state.mouse_wheel_move < 1 || 0.0 <= fVar12)) {
            if (fVar14 < fVar12) {
              if (fVar13 != 120.0 || -1 < input_state.mouse_wheel_move) {
                if (fVar12 <= 0.0) goto LAB_00125695;
                if (0 < input_state.mouse_wheel_move && 0.0 < fVar12) goto LAB_0012571d;
              }
              else {
                fVar15 = (float)input_state.mouse_wheel_move;
                fVar13 = (camera->target).x;
                auVar18._0_4_ = fVar15 * (fVar13 - (camera->position).x) * 1.5;
                auVar18._4_4_ = fVar15 * (fVar12 - fVar14) * 1.5;
                auVar18._8_8_ = 0;
                auVar18 = divps(auVar18,_DAT_00177d10);
                (camera->target).x = auVar18._0_4_ + fVar13;
                (camera->target).y = auVar18._4_4_ + fVar12;
                fVar13 = (camera->target).z;
                (camera->target).z =
                     ((fVar13 - (camera->position).z) * fVar15 * 1.5) / 120.0 + fVar13;
                fVar13 = 120.0;
              }
            }
          }
          else {
LAB_0012571d:
            fVar13 = fVar13 + (float)input_state.mouse_wheel_move * -1.5;
            state->camera_target_distance = fVar13;
            if (fVar13 < 0.3) {
              state->camera_target_distance = 0.3;
              fVar13 = 0.3;
            }
          }
        }
        else {
LAB_00125695:
          fVar16 = (float)input_state.mouse_wheel_move;
          fVar15 = (camera->target).x;
          auVar19._0_4_ = fVar16 * (fVar15 - (camera->position).x) * 1.5;
          auVar19._4_4_ = fVar16 * (fVar12 - fVar14) * 1.5;
          auVar19._8_8_ = 0;
          auVar4._4_4_ = fVar13;
          auVar4._0_4_ = fVar13;
          auVar4._8_8_ = 0;
          auVar18 = divps(auVar19,auVar4);
          (camera->target).x = auVar18._0_4_ + fVar15;
          (camera->target).y = auVar18._4_4_ + fVar12;
          fVar14 = (camera->target).z;
          (camera->target).z = ((fVar14 - (camera->position).z) * fVar16 * 1.5) / fVar13 + fVar14;
        }
      }
      else {
        fVar15 = (float)input_state.mouse_wheel_move;
        fVar13 = (camera->target).x;
        auVar17._0_4_ = fVar15 * (fVar13 - (camera->position).x) * 1.5;
        auVar17._4_4_ = fVar15 * (fVar12 - fVar14) * 1.5;
        auVar17._8_8_ = 0;
        auVar18 = divps(auVar17,_DAT_00177d10);
        (camera->target).x = auVar18._0_4_ + fVar13;
        (camera->target).y = auVar18._4_4_ + fVar12;
        fVar13 = (camera->target).z;
        (camera->target).z = ((fVar13 - (camera->position).z) * fVar15 * 1.5) / 120.0 + fVar13;
        fVar13 = 120.0;
      }
    }
    else {
      fVar13 = fVar13 + (float)input_state.mouse_wheel_move * -1.5;
      state->camera_target_distance = fVar13;
      if (120.0 < fVar13) {
        state->camera_target_distance = 120.0;
        fVar13 = 120.0;
      }
    }
    if (input_state.is_camera_pan_control_key_down != false) {
      if (input_state.is_camera_alt_control_key_down == false) {
        local_58._0_4_ = fVar20 * -0.01;
        local_58._4_4_ = (undefined4)((ulong)camera >> 0x20);
        uStack_40 = 0;
        fVar20 = cosf((state->camera_angle).x);
        fVar21 = local_48._4_4_ * 0.01;
        fVar13 = sinf((state->camera_angle).x);
        fVar14 = sinf((state->camera_angle).y);
        (camera->target).x =
             (state->camera_target_distance / 5.1) *
             (fVar20 * (float)local_58 + fVar14 * fVar13 * fVar21) + (camera->target).x;
        fVar20 = cosf((state->camera_angle).y);
        (camera->target).y =
             (state->camera_target_distance / 5.1) * fVar20 * fVar21 + (camera->target).y;
        local_48 = CONCAT44(local_48._4_4_,(float)local_48 * 0.01);
        fVar20 = sinf((state->camera_angle).x);
        local_58 = (rf_camera3d *)CONCAT44(local_58._4_4_,fVar20);
        fVar20 = cosf((state->camera_angle).x);
        fVar13 = sinf((state->camera_angle).y);
        (camera->target).z =
             (state->camera_target_distance / 5.1) *
             ((float)local_58 * (float)local_48 + fVar13 * fVar20 * fVar21) + (camera->target).z;
      }
      else if (input_state.is_camera_smooth_zoom_control_key == false) {
        fVar21 = fVar21 * -0.01 + (state->camera_angle).y;
        rVar5.y = fVar21;
        rVar5.x = fVar20 * -0.01 + (state->camera_angle).x;
        state->camera_angle = rVar5;
        if (fVar21 <= 1.4835298) {
          if (fVar21 < -1.4835298) {
            (state->camera_angle).y = -1.4835298;
          }
        }
        else {
          (state->camera_angle).y = 1.4835298;
        }
      }
      else {
        state->camera_target_distance = fVar21 * 0.05 + fVar13;
      }
    }
    fVar21 = sinf((state->camera_angle).x);
    fVar20 = state->camera_target_distance;
    fVar13 = cosf((state->camera_angle).y);
    fVar13 = fVar13 * fVar21 * fVar20;
    break;
  case RF_CAMERA_ORBITAL:
    fVar21 = (state->camera_angle).x + 0.01;
    (state->camera_angle).x = fVar21;
    fVar13 = (float)input_state.mouse_wheel_move * -1.5 + state->camera_target_distance;
    fVar20 = 1.2;
    if (1.2 <= fVar13) {
      fVar20 = fVar13;
    }
    state->camera_target_distance = fVar20;
    fVar21 = sinf(fVar21);
    fVar20 = state->camera_target_distance;
    fVar13 = cosf((state->camera_angle).y);
    fVar13 = fVar13 * fVar21 * fVar20;
    camera = local_58;
    break;
  case RF_CAMERA_FIRST_PERSON:
    uStack_40 = 0;
    fVar20 = sinf((state->camera_angle).x);
    fVar21 = (float)input_state.direction_keys[1];
    fVar13 = sinf((state->camera_angle).x);
    fVar15 = (float)input_state.direction_keys[0];
    fVar14 = cosf((state->camera_angle).x);
    local_4c = (float)input_state.direction_keys[3];
    fVar14 = fVar14 * local_4c;
    fVar12 = cosf((state->camera_angle).x);
    prVar6 = local_58;
    local_50 = (float)input_state.direction_keys[2];
    (local_58->position).x =
         (fVar12 * local_50 + ((fVar20 * fVar21 - fVar13 * fVar15) - fVar14)) / 20.0 +
         (local_58->position).x;
    fVar20 = sinf((state->camera_angle).y);
    fVar13 = sinf((state->camera_angle).y);
    (prVar6->position).y =
         (((float)input_state.direction_keys[4] + (fVar20 * fVar15 - fVar13 * fVar21)) -
         (float)input_state.direction_keys[5]) / 20.0 + (prVar6->position).y;
    fVar20 = cosf((state->camera_angle).x);
    fVar13 = cosf((state->camera_angle).x);
    fVar14 = sinf((state->camera_angle).x);
    fVar14 = fVar14 * local_4c;
    fVar12 = sinf((state->camera_angle).x);
    (prVar6->position).z =
         ((fVar14 + (fVar20 * fVar21 - fVar13 * fVar15)) - fVar12 * local_50) / 20.0 +
         (prVar6->position).z;
    bVar10 = true;
    if (input_state.direction_keys[0] == false) {
      uVar7 = 0;
      do {
        uVar9 = uVar7;
        if (uVar9 == 5) break;
        uVar7 = uVar9 + 1;
      } while (local_5d[uVar9] != '\x01');
      bVar10 = uVar9 < 5;
    }
    fVar21 = (float)local_48 * -0.003 + (state->camera_angle).x;
    fVar13 = local_48._4_4_ * -0.003 + (state->camera_angle).y;
    rVar3.y = fVar13;
    rVar3.x = fVar21;
    state->camera_angle = rVar3;
    fVar20 = 1.4835298;
    if ((1.4835298 < fVar13) || (fVar20 = -1.4835298, fVar13 < -1.4835298)) {
      (state->camera_angle).y = fVar20;
    }
    fVar20 = (prVar6->position).x;
    fVar21 = sinf(fVar21);
    (prVar6->target).x = fVar20 - fVar21 * 25.0;
    fVar20 = (prVar6->position).y;
    fVar21 = sinf((state->camera_angle).y);
    (prVar6->target).y = fVar21 * 25.0 + fVar20;
    fVar20 = (prVar6->position).z;
    fVar21 = cosf((state->camera_angle).x);
    (prVar6->target).z = fVar20 - fVar21 * 25.0;
    iVar8 = state->swing_counter;
    if (bVar10) {
      iVar8 = iVar8 + 1;
      state->swing_counter = iVar8;
    }
    fVar20 = state->player_eyes_position;
    fVar21 = sinf((float)iVar8 / 5.0);
    (prVar6->position).y = fVar21 / -30.0 + fVar20;
    fVar20 = sinf((float)state->swing_counter / 10.0);
    (prVar6->up).x = fVar20 / 200.0;
    fVar20 = sinf((float)state->swing_counter / 10.0);
    (prVar6->up).z = fVar20 / -200.0;
    return;
  case RF_CAMERA_THIRD_PERSON:
    local_4c = (float)input_state.mouse_wheel_move;
    local_48 = CONCAT44(fVar21,fVar20);
    uStack_40 = 0;
    sinf((state->camera_angle).x);
    sinf((state->camera_angle).x);
    cosf((state->camera_angle).x);
    local_34 = (float)input_state.direction_keys[3];
    cosf((state->camera_angle).x);
    local_50 = (float)input_state.direction_keys[2];
    fVar20 = sinf((state->camera_angle).y);
    fVar21 = sinf((state->camera_angle).y);
    camera = local_58;
    (local_58->position).y =
         (((float)input_state.direction_keys[4] +
          (fVar20 * (float)input_state.direction_keys[0] -
          fVar21 * (float)input_state.direction_keys[1])) - (float)input_state.direction_keys[5]) /
         20.0 + (local_58->position).y;
    fVar20 = cosf((state->camera_angle).x);
    fVar21 = cosf((state->camera_angle).x);
    fVar13 = sinf((state->camera_angle).x);
    fVar13 = fVar13 * local_34;
    fVar14 = sinf((state->camera_angle).x);
    (camera->position).z =
         ((fVar13 + (fVar20 * (float)input_state.direction_keys[1] -
                    fVar21 * (float)input_state.direction_keys[0])) - fVar14 * local_50) / 20.0 +
         (camera->position).z;
    fVar21 = (float)local_48 * -0.003 + (state->camera_angle).x;
    fVar13 = local_48._4_4_ * -0.003 + (state->camera_angle).y;
    rVar1.y = fVar13;
    rVar1.x = fVar21;
    state->camera_angle = rVar1;
    fVar20 = 0.08726646;
    if ((0.08726646 < fVar13) || (fVar20 = -1.4835298, fVar13 < -1.4835298)) {
      (state->camera_angle).y = fVar20;
    }
    fVar13 = (float)(int)local_4c * -1.5 + state->camera_target_distance;
    fVar20 = 1.2;
    if (1.2 <= fVar13) {
      fVar20 = fVar13;
    }
    state->camera_target_distance = fVar20;
    fVar21 = sinf(fVar21);
    fVar20 = state->camera_target_distance;
    fVar13 = cosf((state->camera_angle).y);
    (camera->position).x = fVar13 * fVar21 * fVar20 + (camera->target).x;
    fVar20 = (state->camera_angle).y;
    fVar21 = sinf(fVar20);
    if (0.0 < fVar20) {
      fVar21 = -fVar21;
    }
    fVar20 = state->camera_target_distance;
    fVar13 = sinf((state->camera_angle).y);
    fVar13 = fVar13 * fVar21 * fVar20;
    goto LAB_001259d1;
  }
  (camera->position).x = fVar13 + (camera->target).x;
  fVar20 = (state->camera_angle).y;
  fVar21 = sinf(fVar20);
  uVar11 = -(uint)(fVar20 <= 0.0);
  fVar20 = state->camera_target_distance;
  fVar13 = sinf((state->camera_angle).y);
  fVar13 = fVar13 * (float)(~uVar11 & (uint)-fVar21 | (uint)fVar21 & uVar11) * fVar20;
LAB_001259d1:
  (camera->position).y = fVar13 + (camera->target).y;
  fVar21 = cosf((state->camera_angle).x);
  fVar20 = state->camera_target_distance;
  fVar13 = cosf((state->camera_angle).y);
  (camera->position).z = fVar13 * fVar21 * fVar20 + (camera->target).z;
  return;
}

Assistant:

RF_API void rf_update_camera3d(rf_camera3d* camera, rf_camera3d_state* state, rf_input_state_for_update_camera input_state)
{
    // rf_camera3d mouse movement sensitivity
    #define RF_CAMERA_MOUSE_MOVE_SENSITIVITY 0.003f
    #define RF_CAMERA_MOUSE_SCROLL_SENSITIVITY 1.5f

    // FREE_CAMERA
    #define RF_CAMERA_FREE_MOUSE_SENSITIVITY 0.01f
    #define RF_CAMERA_FREE_DISTANCE_MIN_CLAMP 0.3f
    #define RF_CAMERA_FREE_DISTANCE_MAX_CLAMP 120.0f
    #define RF_CAMERA_FREE_MIN_CLAMP 85.0f
    #define RF_CAMERA_FREE_MAX_CLAMP -85.0f
    #define RF_CAMERA_FREE_SMOOTH_ZOOM_SENSITIVITY 0.05f
    #define RF_CAMERA_FREE_PANNING_DIVIDER 5.1f

    // ORBITAL_CAMERA
    #define RF_CAMERA_ORBITAL_SPEED 0.01f // Radians per frame

    // FIRST_PERSON
    //#define CAMERA_FIRST_PERSON_MOUSE_SENSITIVITY           0.003f
    #define RF_CAMERA_FIRST_PERSON_FOCUS_DISTANCE 25.0f
    #define RF_CAMERA_FIRST_PERSON_MIN_CLAMP 85.0f
    #define RF_CAMERA_FIRST_PERSON_MAX_CLAMP -85.0f

    #define RF_CAMERA_FIRST_PERSON_STEP_TRIGONOMETRIC_DIVIDER 5.0f
    #define RF_CAMERA_FIRST_PERSON_STEP_DIVIDER 30.0f
    #define RF_CAMERA_FIRST_PERSON_WAVING_DIVIDER 200.0f

    // THIRD_PERSON
    //#define CAMERA_THIRD_PERSON_MOUSE_SENSITIVITY           0.003f
    #define RF_CAMERA_THIRD_PERSON_DISTANCE_CLAMP 1.2f
    #define RF_CAMERA_THIRD_PERSON_MIN_CLAMP 5.0f
    #define RF_CAMERA_THIRD_PERSON_MAX_CLAMP -85.0f
    #define RF_CAMERA_THIRD_PERSON_OFFSET (rf_vec3) { 0.4f, 0.0f, 0.0f }

    // PLAYER (used by camera)
    #define RF_PLAYER_MOVEMENT_SENSITIVITY 20.0f

    // rf_camera3d move modes (first person and third person cameras)
    typedef enum rf_camera_move
    {
        rf_move_front = 0,
        rf_move_back,
        rf_move_right,
        rf_move_left,
        rf_move_up,
        rf_move_down
    } rf_camera_move;

    // RF_INTERNAL float player_eyes_position = 1.85f;

    // TODO: CRF_INTERNAL rf_ctx->gl_ctx.camera_target_distance and rf_ctx->gl_ctx.camera_angle here

    // Mouse movement detection
    rf_vec2 mouse_position_delta = { 0.0f, 0.0f };
    rf_vec2 mouse_position = input_state.mouse_position;
    int mouse_wheel_move = input_state.mouse_wheel_move;

    // Keys input detection
    bool pan_key = input_state.is_camera_pan_control_key_down;
    bool alt_key = input_state.is_camera_alt_control_key_down;
    bool szoom_key = input_state.is_camera_smooth_zoom_control_key;

    bool direction[6];
    direction[0] = input_state.direction_keys[0];
    direction[1] = input_state.direction_keys[1];
    direction[2] = input_state.direction_keys[2];
    direction[3] = input_state.direction_keys[3];
    direction[4] = input_state.direction_keys[4];
    direction[5] = input_state.direction_keys[5];

    // TODO: Consider touch inputs for camera

    if (state->camera_mode != RF_CAMERA_CUSTOM)
    {
        mouse_position_delta.x = mouse_position.x - state->previous_mouse_position.x;
        mouse_position_delta.y = mouse_position.y - state->previous_mouse_position.y;

        state->previous_mouse_position = mouse_position;
    }

    // Support for multiple automatic camera modes
    switch (state->camera_mode)
    {
        case RF_CAMERA_FREE:
        {
            // Camera zoom
            if ((state->camera_target_distance < RF_CAMERA_FREE_DISTANCE_MAX_CLAMP) && (mouse_wheel_move < 0))
            {
                state->camera_target_distance -= (mouse_wheel_move * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY);

                if (state->camera_target_distance > RF_CAMERA_FREE_DISTANCE_MAX_CLAMP) {
                    state->camera_target_distance = RF_CAMERA_FREE_DISTANCE_MAX_CLAMP;
                }
            }
            // Camera looking down
            // TODO: Review, weird comparisson of rf_ctx->gl_ctx.camera_target_distance == 120.0f?
            else if ((camera->position.y > camera->target.y) && (state->camera_target_distance == RF_CAMERA_FREE_DISTANCE_MAX_CLAMP) && (mouse_wheel_move < 0))
            {
                camera->target.x += mouse_wheel_move * (camera->target.x - camera->position.x) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;
                camera->target.y += mouse_wheel_move * (camera->target.y - camera->position.y) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;
                camera->target.z += mouse_wheel_move * (camera->target.z - camera->position.z) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;
            }
            else if ((camera->position.y > camera->target.y) && (camera->target.y >= 0))
            {
                camera->target.x += mouse_wheel_move * (camera->target.x - camera->position.x) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;
                camera->target.y += mouse_wheel_move * (camera->target.y - camera->position.y) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;
                camera->target.z += mouse_wheel_move * (camera->target.z - camera->position.z) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;

                // if (camera->target.y < 0) camera->target.y = -0.001;
            }
            else if ((camera->position.y > camera->target.y) && (camera->target.y < 0) && (mouse_wheel_move > 0))
            {
                state->camera_target_distance -= (mouse_wheel_move * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY);
                if (state->camera_target_distance < RF_CAMERA_FREE_DISTANCE_MIN_CLAMP) {
                    state->camera_target_distance = RF_CAMERA_FREE_DISTANCE_MIN_CLAMP;
                }
            }
            // Camera looking up
            // TODO: Review, weird comparisson of rf_ctx->gl_ctx.camera_target_distance == 120.0f?
            else if ((camera->position.y < camera->target.y) && (state->camera_target_distance == RF_CAMERA_FREE_DISTANCE_MAX_CLAMP) && (mouse_wheel_move < 0))
            {
                camera->target.x += mouse_wheel_move * (camera->target.x - camera->position.x) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;
                camera->target.y += mouse_wheel_move * (camera->target.y - camera->position.y) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;
                camera->target.z += mouse_wheel_move * (camera->target.z - camera->position.z) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;
            }
            else if ((camera->position.y < camera->target.y) && (camera->target.y <= 0))
            {
                camera->target.x += mouse_wheel_move * (camera->target.x - camera->position.x) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;
                camera->target.y += mouse_wheel_move * (camera->target.y - camera->position.y) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;
                camera->target.z += mouse_wheel_move * (camera->target.z - camera->position.z) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;

                // if (camera->target.y > 0) camera->target.y = 0.001;
            }
            else if ((camera->position.y < camera->target.y) && (camera->target.y > 0) && (mouse_wheel_move > 0))
            {
                state->camera_target_distance -= (mouse_wheel_move * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY);
                if (state->camera_target_distance < RF_CAMERA_FREE_DISTANCE_MIN_CLAMP) {
                    state->camera_target_distance = RF_CAMERA_FREE_DISTANCE_MIN_CLAMP;
                }
            }

            // Input keys checks
            if (pan_key)
            {
                if (alt_key) // Alternative key behaviour
                {
                    if (szoom_key)
                    {
                        // Camera smooth zoom
                        state->camera_target_distance += (mouse_position_delta.y * RF_CAMERA_FREE_SMOOTH_ZOOM_SENSITIVITY);
                    }
                    else
                    {
                        // Camera rotation
                        state->camera_angle.x += mouse_position_delta.x*-RF_CAMERA_FREE_MOUSE_SENSITIVITY;
                        state->camera_angle.y += mouse_position_delta.y*-RF_CAMERA_FREE_MOUSE_SENSITIVITY;

                        // Angle clamp
                        if (state->camera_angle.y > RF_CAMERA_FREE_MIN_CLAMP * RF_DEG2RAD) {
                            state->camera_angle.y = RF_CAMERA_FREE_MIN_CLAMP * RF_DEG2RAD;
                        }
                        else if (state->camera_angle.y < RF_CAMERA_FREE_MAX_CLAMP * RF_DEG2RAD) {
                            state->camera_angle.y = RF_CAMERA_FREE_MAX_CLAMP * RF_DEG2RAD;
                        }
                    }
                }
                else
                {
                    // Camera panning
                    camera->target.x += ((mouse_position_delta.x*-RF_CAMERA_FREE_MOUSE_SENSITIVITY) * cosf(state->camera_angle.x) + (mouse_position_delta.y * RF_CAMERA_FREE_MOUSE_SENSITIVITY) * sinf(state->camera_angle.x) * sinf(state->camera_angle.y)) * (state->camera_target_distance / RF_CAMERA_FREE_PANNING_DIVIDER);
                    camera->target.y += ((mouse_position_delta.y * RF_CAMERA_FREE_MOUSE_SENSITIVITY) * cosf(state->camera_angle.y)) * (state->camera_target_distance / RF_CAMERA_FREE_PANNING_DIVIDER);
                    camera->target.z += ((mouse_position_delta.x * RF_CAMERA_FREE_MOUSE_SENSITIVITY) * sinf(state->camera_angle.x) + (mouse_position_delta.y * RF_CAMERA_FREE_MOUSE_SENSITIVITY) * cosf(state->camera_angle.x) * sinf(state->camera_angle.y)) * (state->camera_target_distance / RF_CAMERA_FREE_PANNING_DIVIDER);
                }
            }

            // Update camera position with changes
            camera->position.x = sinf(state->camera_angle.x)*state->camera_target_distance*cosf(state->camera_angle.y) + camera->target.x;
            camera->position.y = ((state->camera_angle.y <= 0.0f)? 1 : -1)*sinf(state->camera_angle.y)*state->camera_target_distance*sinf(state->camera_angle.y) + camera->target.y;
            camera->position.z = cosf(state->camera_angle.x)*state->camera_target_distance*cosf(state->camera_angle.y) + camera->target.z;

        } break;

        case RF_CAMERA_ORBITAL:
        {
            state->camera_angle.x += RF_CAMERA_ORBITAL_SPEED; // Camera orbit angle
            state->camera_target_distance -= (mouse_wheel_move * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY); // Camera zoom

            // Camera distance clamp
            if (state->camera_target_distance < RF_CAMERA_THIRD_PERSON_DISTANCE_CLAMP) {
                state->camera_target_distance = RF_CAMERA_THIRD_PERSON_DISTANCE_CLAMP;
            }

            // Update camera position with changes
            camera->position.x = sinf(state->camera_angle.x)*state->camera_target_distance*cosf(state->camera_angle.y) + camera->target.x;
            camera->position.y = ((state->camera_angle.y <= 0.0f)? 1 : -1)*sinf(state->camera_angle.y)*state->camera_target_distance*sinf(state->camera_angle.y) + camera->target.y;
            camera->position.z = cosf(state->camera_angle.x)*state->camera_target_distance*cosf(state->camera_angle.y) + camera->target.z;

        } break;

        case RF_CAMERA_FIRST_PERSON:
        {
            camera->position.x += (sinf(state->camera_angle.x)*direction[rf_move_back] -
                                   sinf(state->camera_angle.x)*direction[rf_move_front] -
                                   cosf(state->camera_angle.x)*direction[rf_move_left] +
                                   cosf(state->camera_angle.x)*direction[rf_move_right]) / RF_PLAYER_MOVEMENT_SENSITIVITY;

            camera->position.y += (sinf(state->camera_angle.y)*direction[rf_move_front] -
                                   sinf(state->camera_angle.y)*direction[rf_move_back] +
                                   1.0f*direction[rf_move_up] - 1.0f*direction[rf_move_down]) / RF_PLAYER_MOVEMENT_SENSITIVITY;

            camera->position.z += (cosf(state->camera_angle.x)*direction[rf_move_back] -
                                   cosf(state->camera_angle.x)*direction[rf_move_front] +
                                   sinf(state->camera_angle.x)*direction[rf_move_left] -
                                   sinf(state->camera_angle.x)*direction[rf_move_right]) / RF_PLAYER_MOVEMENT_SENSITIVITY;

            bool is_moving = false; // Required for swinging

            for (rf_int i = 0; i < 6; i++) if (direction[i]) { is_moving = true; break; }

            // Camera orientation calculation
            state->camera_angle.x += (mouse_position_delta.x*-RF_CAMERA_MOUSE_MOVE_SENSITIVITY);
            state->camera_angle.y += (mouse_position_delta.y*-RF_CAMERA_MOUSE_MOVE_SENSITIVITY);

            // Angle clamp
            if (state->camera_angle.y > RF_CAMERA_FIRST_PERSON_MIN_CLAMP * RF_DEG2RAD) {
                state->camera_angle.y = RF_CAMERA_FIRST_PERSON_MIN_CLAMP * RF_DEG2RAD;
            }
            else if (state->camera_angle.y < RF_CAMERA_FIRST_PERSON_MAX_CLAMP * RF_DEG2RAD) {
                state->camera_angle.y = RF_CAMERA_FIRST_PERSON_MAX_CLAMP * RF_DEG2RAD;
            }

            // Camera is always looking at player
            camera->target.x = camera->position.x - sinf(state->camera_angle.x) * RF_CAMERA_FIRST_PERSON_FOCUS_DISTANCE;
            camera->target.y = camera->position.y + sinf(state->camera_angle.y) * RF_CAMERA_FIRST_PERSON_FOCUS_DISTANCE;
            camera->target.z = camera->position.z - cosf(state->camera_angle.x) * RF_CAMERA_FIRST_PERSON_FOCUS_DISTANCE;

            if (is_moving) {
                state->swing_counter++;
            }

            // Camera position update
            // NOTE: On RF_CAMERA_FIRST_PERSON player Y-movement is limited to player 'eyes position'
            camera->position.y = state->player_eyes_position - sinf(state->swing_counter / RF_CAMERA_FIRST_PERSON_STEP_TRIGONOMETRIC_DIVIDER) / RF_CAMERA_FIRST_PERSON_STEP_DIVIDER;

            camera->up.x = sinf(state->swing_counter/(RF_CAMERA_FIRST_PERSON_STEP_TRIGONOMETRIC_DIVIDER * 2)) / RF_CAMERA_FIRST_PERSON_WAVING_DIVIDER;
            camera->up.z = -sinf(state->swing_counter/(RF_CAMERA_FIRST_PERSON_STEP_TRIGONOMETRIC_DIVIDER * 2)) / RF_CAMERA_FIRST_PERSON_WAVING_DIVIDER;

        } break;

        case RF_CAMERA_THIRD_PERSON:
        {
            camera->position.x += (sinf(state->camera_angle.x)*direction[rf_move_back] -
                                   sinf(state->camera_angle.x)*direction[rf_move_front] -
                                   cosf(state->camera_angle.x)*direction[rf_move_left] +
                                   cosf(state->camera_angle.x)*direction[rf_move_right]) / RF_PLAYER_MOVEMENT_SENSITIVITY;

            camera->position.y += (sinf(state->camera_angle.y)*direction[rf_move_front] -
                                   sinf(state->camera_angle.y)*direction[rf_move_back] +
                                   1.0f*direction[rf_move_up] - 1.0f*direction[rf_move_down]) / RF_PLAYER_MOVEMENT_SENSITIVITY;

            camera->position.z += (cosf(state->camera_angle.x)*direction[rf_move_back] -
                                   cosf(state->camera_angle.x)*direction[rf_move_front] +
                                   sinf(state->camera_angle.x)*direction[rf_move_left] -
                                   sinf(state->camera_angle.x)*direction[rf_move_right]) / RF_PLAYER_MOVEMENT_SENSITIVITY;

            // Camera orientation calculation
            state->camera_angle.x += (mouse_position_delta.x*-RF_CAMERA_MOUSE_MOVE_SENSITIVITY);
            state->camera_angle.y += (mouse_position_delta.y*-RF_CAMERA_MOUSE_MOVE_SENSITIVITY);

            // Angle clamp
            if (state->camera_angle.y > RF_CAMERA_THIRD_PERSON_MIN_CLAMP * RF_DEG2RAD)
            {
                state->camera_angle.y = RF_CAMERA_THIRD_PERSON_MIN_CLAMP * RF_DEG2RAD;
            }
            else if (state->camera_angle.y < RF_CAMERA_THIRD_PERSON_MAX_CLAMP * RF_DEG2RAD)
            {
                state->camera_angle.y = RF_CAMERA_THIRD_PERSON_MAX_CLAMP * RF_DEG2RAD;
            }

            // Camera zoom
            state->camera_target_distance -= (mouse_wheel_move * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY);

            // Camera distance clamp
            if (state->camera_target_distance < RF_CAMERA_THIRD_PERSON_DISTANCE_CLAMP)
            {
                state->camera_target_distance = RF_CAMERA_THIRD_PERSON_DISTANCE_CLAMP;
            }

            // TODO: It seems camera->position is not correctly updated or some rounding issue makes the camera move straight to camera->target...
            camera->position.x = sinf(state->camera_angle.x)*state->camera_target_distance*cosf(state->camera_angle.y) + camera->target.x;

            if (state->camera_angle.y <= 0.0f)
            {
                camera->position.y = sinf(state->camera_angle.y)*state->camera_target_distance*sinf(state->camera_angle.y) + camera->target.y;
            }
            else
            {
                camera->position.y = -sinf(state->camera_angle.y)*state->camera_target_distance*sinf(state->camera_angle.y) + camera->target.y;
            }

            camera->position.z = cosf(state->camera_angle.x)*state->camera_target_distance*cosf(state->camera_angle.y) + camera->target.z;

        } break;

        default: break;
    }
}